

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

void halfsiphash_test(void *input,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uchar key [16];
  ulong local_18 [2];
  
  local_18[1] = 0;
  if (len == 0) {
    uVar1 = 0;
  }
  else {
    local_18[0] = (ulong)seed;
    uVar1 = halfsiphash((uchar *)local_18,(uchar *)input,(long)len);
  }
  *(uint32_t *)out = uVar1;
  return;
}

Assistant:

void
halfsiphash_test(const void *input, int len, uint32_t seed, void *out)
{
  unsigned char	key[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  memcpy(key, &seed, sizeof(seed));
  // objsize: 0x780-0xa3c: 700
  *(uint32_t *) out = halfsiphash(key, (const unsigned char *)input, (size_t) len);
}